

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool __thiscall
dxil_spv::Converter::Impl::get_ssbo_offset_buffer_id
          (Impl *this,Id *buffer_id,VulkanBinding *buffer_binding,VulkanBinding *offset_binding,
          ResourceKind kind,uint alignment)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Id IVar3;
  LoggingCallback p_Var4;
  void *pvVar5;
  char *__ptr;
  size_t sStack_1020;
  char buffer [4096];
  
  *buffer_id = 0;
  if (2 < (byte)(kind - TypedBuffer)) {
    return true;
  }
  if (buffer_binding->descriptor_type == SSBO) {
    if (kind == TypedBuffer) {
      return true;
    }
    if (((this->options).ssbo_alignment - 1 & alignment) == 0) {
      return true;
    }
    if ((buffer_binding->bindless).use_heap == false) {
      p_Var4 = get_thread_log_callback();
      if (p_Var4 == (LoggingCallback)0x0) {
        __ptr = "[ERROR]: SSBO offset is only supported for bindless SSBOs.\n";
        sStack_1020 = 0x3b;
LAB_00110812:
        fwrite(__ptr,sStack_1020,1,_stderr);
        fflush(_stderr);
        return false;
      }
      builtin_strncpy(buffer + 0xc,"is only supported for bindless SSBOs.\n",0x27);
    }
    else {
      if ((offset_binding->bindless).use_heap != true) goto LAB_0011075f;
      p_Var4 = get_thread_log_callback();
      if (p_Var4 == (LoggingCallback)0x0) {
        __ptr = "[ERROR]: SSBO offset buffer must be a bindless buffer.\n";
        sStack_1020 = 0x37;
        goto LAB_00110812;
      }
      builtin_strncpy(buffer + 0x20,"dless buffer.\n",0xf);
      builtin_strncpy(buffer + 0x10,"er must be a bin",0x10);
      builtin_strncpy(buffer + 0xc,"buff",4);
    }
    builtin_strncpy(buffer,"SSBO offset ",0xc);
    pvVar5 = get_thread_log_callback_userdata();
    (*p_Var4)(pvVar5,Error,buffer);
    return false;
  }
  if ((this->options).bindless_typed_buffer_offsets != true) {
    return true;
  }
  if (((buffer_binding->bindless).use_heap & 1U) == 0) {
    return true;
  }
LAB_0011075f:
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  buffer[0x10] = '\x01';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x18] = '\x01';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  uVar1 = offset_binding->descriptor_set;
  uVar2 = offset_binding->binding;
  buffer[0] = '\0';
  buffer[1] = '\x05';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\v';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer._28_4_ = uVar1;
  buffer._32_4_ = uVar2;
  IVar3 = create_bindless_heap_variable(this,(BindlessInfo *)buffer);
  *buffer_id = IVar3;
  return true;
}

Assistant:

bool Converter::Impl::get_ssbo_offset_buffer_id(spv::Id &buffer_id,
                                                const VulkanBinding &buffer_binding,
                                                const VulkanBinding &offset_binding,
                                                DXIL::ResourceKind kind, unsigned alignment)
{
	buffer_id = 0;

	bool is_buffer_type = kind == DXIL::ResourceKind::StructuredBuffer ||
	                      kind == DXIL::ResourceKind::RawBuffer ||
	                      kind == DXIL::ResourceKind::TypedBuffer;
	if (!is_buffer_type)
		return true;

	bool use_offsets = false;

	// If we're emitting an SSBO where we expect small alignment, we'll need to carry forward an "offset".
	if (buffer_binding.descriptor_type == VulkanDescriptorType::SSBO)
	{
		if (kind != DXIL::ResourceKind::TypedBuffer && (alignment & (options.ssbo_alignment - 1)) != 0)
		{
			if (!buffer_binding.bindless.use_heap)
			{
				LOGE("SSBO offset is only supported for bindless SSBOs.\n");
				return false;
			}

			if (offset_binding.bindless.use_heap)
			{
				LOGE("SSBO offset buffer must be a bindless buffer.\n");
				return false;
			}

			use_offsets = true;
		}
	}
	else if (options.bindless_typed_buffer_offsets && buffer_binding.bindless.use_heap)
	{
		use_offsets = true;
	}

	if (use_offsets)
	{
		BindlessInfo bindless_info = {};
		bindless_info.descriptor_type = VulkanDescriptorType::SSBO;
		bindless_info.type = DXIL::ResourceType::SRV;
		bindless_info.offsets = true;
		bindless_info.desc_set = offset_binding.descriptor_set;
		bindless_info.binding = offset_binding.binding;
		bindless_info.component = DXIL::ComponentType::U32;
		bindless_info.kind = DXIL::ResourceKind::RawBuffer;
		buffer_id = create_bindless_heap_variable(bindless_info);
	}

	return true;
}